

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

int __thiscall llvm::raw_fd_ostream::close(raw_fd_ostream *this,int __fd)

{
  int iVar1;
  error_code eVar2;
  
  if (this->ShouldClose != false) {
    this->ShouldClose = false;
    raw_ostream::flush((raw_ostream *)this);
    eVar2 = sys::Process::SafelyCloseFileDescriptor(this->FD);
    iVar1 = eVar2._M_value;
    if (iVar1 != 0) {
      (this->EC)._M_value = iVar1;
      (this->EC)._M_cat = eVar2._M_cat;
    }
    this->FD = -1;
    return iVar1;
  }
  __assert_fail("ShouldClose",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/raw_ostream.cpp"
                ,0x29b,"void llvm::raw_fd_ostream::close()");
}

Assistant:

void raw_fd_ostream::close() {
  assert(ShouldClose);
  ShouldClose = false;
  flush();
  if (auto EC = sys::Process::SafelyCloseFileDescriptor(FD))
    error_detected(EC);
  FD = -1;
}